

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.cpp
# Opt level: O3

shared_ptr<HDD> __thiscall
HDD::CreateDisk(HDD *this,string *path,int64_t llTotalBytes_,IDENTIFYDEVICE *pIdentify_,
               bool fOverwrite_)

{
  bool bVar1;
  int iVar2;
  HDD *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  shared_ptr<HDD> sVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  this->_vptr_HDD = (_func_int **)0x0;
  this->h = 0;
  this->cyls = 0;
  bVar1 = IsHddImage(path);
  _Var3._M_pi = extraout_RDX;
  if (bVar1) {
    this_00 = (HDD *)operator_new(0x298);
    memset(this_00,0,0x298);
    HDD(this_00);
    this_00->_vptr_HDD = (_func_int **)&PTR__HDD_001db3a0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<HDFHDD*>
              (&local_38,(HDFHDD *)this_00);
    this->_vptr_HDD = (_func_int **)this_00;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->h = local_38._M_pi;
    _Var3._M_pi = extraout_RDX_00;
    if (this_00 != (HDD *)0x0) {
      iVar2 = (*this_00->_vptr_HDD[8])(this_00,path,llTotalBytes_,pIdentify_,(ulong)fOverwrite_);
      _Var3._M_pi = extraout_RDX_01;
      if ((char)iVar2 == '\0') {
        this->_vptr_HDD = (_func_int **)0x0;
        this->h = 0;
        this->cyls = 0;
        if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
          _Var3._M_pi = extraout_RDX_02;
        }
      }
    }
  }
  sVar4.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<HDD>)sVar4.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<HDD> HDD::CreateDisk(const std::string& path, int64_t llTotalBytes_, const IDENTIFYDEVICE* pIdentify_, bool fOverwrite_)
{
    std::shared_ptr<HDD> hdd;

    if (IsHddImage(path))
        hdd = std::shared_ptr<HDD>(new HDFHDD());

    if (hdd && !hdd->Create(path, llTotalBytes_, pIdentify_, fOverwrite_))
        hdd.reset();

    return hdd;
}